

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

SQFunctionProto * __thiscall SQFuncState::BuildProto(SQFuncState *this)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  SQObjectType SVar5;
  SQObjectType SVar6;
  uint uVar7;
  uint uVar8;
  SQTable *pSVar9;
  SQTable *pSVar10;
  SQObjectPtr *pSVar11;
  SQObjectPtr *pSVar12;
  long *plVar13;
  long lVar14;
  SQOuterVar *pSVar15;
  SQOuterVar *pSVar16;
  SQLocalVarInfo *pSVar17;
  SQLocalVarInfo *pSVar18;
  longlong *plVar19;
  SQInteger *pSVar20;
  undefined8 uVar21;
  SQFunctionProto *pSVar22;
  SQObjectValue SVar23;
  ulong uVar24;
  long lVar25;
  SQObjectPtr refidx;
  SQObjectPtr key;
  SQObjectPtr val;
  
  pSVar22 = SQFunctionProto::Create
                      (this->_ss,(this->_instructions)._size,this->_nliterals,
                       (this->_parameters)._size,(this->_functions)._size,(this->_outervalues)._size
                       ,(this->_lineinfos)._size,(this->_localvarinfos)._size,
                       (this->_defaultparams)._size);
  refidx.super_SQObject._type = OT_NULL;
  refidx.super_SQObject._unVal.pTable = (SQTable *)0x0;
  key.super_SQObject._type = OT_NULL;
  key.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  pSVar22->_stacksize = this->_stacksize;
  SVar5 = (pSVar22->_sourcename).super_SQObject._type;
  pSVar9 = (pSVar22->_sourcename).super_SQObject._unVal.pTable;
  pSVar10 = (this->_sourcename).super_SQObject._unVal.pTable;
  (pSVar22->_sourcename).super_SQObject._unVal.pTable = pSVar10;
  SVar6 = (this->_sourcename).super_SQObject._type;
  (pSVar22->_sourcename).super_SQObject._type = SVar6;
  if ((SVar6 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar22->_bgenerator = this->_bgenerator;
  SVar5 = (pSVar22->_name).super_SQObject._type;
  pSVar9 = (pSVar22->_name).super_SQObject._unVal.pTable;
  pSVar10 = (this->_name).super_SQObject._unVal.pTable;
  (pSVar22->_name).super_SQObject._unVal.pTable = pSVar10;
  SVar6 = (this->_name).super_SQObject._type;
  (pSVar22->_name).super_SQObject._type = SVar6;
  if ((SVar6 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  while( true ) {
    SVar23.nInteger =
         SQTable::Next((this->_literals).super_SQObject._unVal.pTable,false,&refidx,&key,&val);
    if (SVar23.pTable == (SQTable *)0xffffffffffffffff) break;
    pSVar11 = pSVar22->_literals;
    SVar5 = pSVar11[val.super_SQObject._unVal.nInteger].super_SQObject._type;
    pSVar9 = pSVar11[val.super_SQObject._unVal.nInteger].super_SQObject._unVal.pTable;
    pSVar11[val.super_SQObject._unVal.nInteger].super_SQObject._unVal = key.super_SQObject._unVal;
    pSVar11[val.super_SQObject._unVal.nInteger].super_SQObject._type = key.super_SQObject._type;
    if ((key.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((key.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    if ((refidx.super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &((refidx.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*((refidx.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    refidx.super_SQObject._type = OT_INTEGER;
    refidx.super_SQObject._unVal.nInteger = SVar23.nInteger;
  }
  if ((this->_functions)._size != 0) {
    lVar25 = 8;
    uVar24 = 0;
    do {
      pSVar11 = (this->_functions)._vals;
      pSVar12 = pSVar22->_functions;
      uVar7 = *(uint *)((long)pSVar12 + lVar25 + -8);
      plVar13 = *(long **)((long)&(pSVar12->super_SQObject)._type + lVar25);
      lVar14 = *(long *)((long)&(pSVar11->super_SQObject)._type + lVar25);
      *(long *)((long)&(pSVar12->super_SQObject)._type + lVar25) = lVar14;
      uVar8 = *(uint *)((long)pSVar11 + lVar25 + -8);
      *(uint *)((long)pSVar12 + lVar25 + -8) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(lVar14 + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar13 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar13 + 0x10))();
        }
      }
      uVar24 = uVar24 + 1;
      lVar25 = lVar25 + 0x10;
    } while (uVar24 < (this->_functions)._size);
  }
  if ((this->_parameters)._size != 0) {
    lVar25 = 8;
    uVar24 = 0;
    do {
      pSVar11 = (this->_parameters)._vals;
      pSVar12 = pSVar22->_parameters;
      uVar7 = *(uint *)((long)pSVar12 + lVar25 + -8);
      plVar13 = *(long **)((long)&(pSVar12->super_SQObject)._type + lVar25);
      lVar14 = *(long *)((long)&(pSVar11->super_SQObject)._type + lVar25);
      *(long *)((long)&(pSVar12->super_SQObject)._type + lVar25) = lVar14;
      uVar8 = *(uint *)((long)pSVar11 + lVar25 + -8);
      *(uint *)((long)pSVar12 + lVar25 + -8) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(lVar14 + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar13 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar13 + 0x10))();
        }
      }
      uVar24 = uVar24 + 1;
      lVar25 = lVar25 + 0x10;
    } while (uVar24 < (this->_parameters)._size);
  }
  if ((this->_outervalues)._size != 0) {
    lVar25 = 0x20;
    uVar24 = 0;
    do {
      pSVar15 = (this->_outervalues)._vals;
      pSVar16 = pSVar22->_outervalues;
      *(undefined4 *)((long)pSVar16 + lVar25 + -0x20) =
           *(undefined4 *)((long)pSVar15 + lVar25 + -0x20);
      uVar7 = *(uint *)((long)pSVar16 + lVar25 + -0x18);
      plVar13 = *(long **)((long)pSVar16 + lVar25 + -0x10);
      lVar14 = *(long *)((long)pSVar15 + lVar25 + -0x10);
      *(long *)((long)pSVar16 + lVar25 + -0x10) = lVar14;
      uVar8 = *(uint *)((long)pSVar15 + lVar25 + -0x18);
      *(uint *)((long)pSVar16 + lVar25 + -0x18) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(lVar14 + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar13 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar13 + 0x10))();
        }
      }
      uVar7 = *(uint *)((long)pSVar16 + lVar25 + -8);
      plVar13 = *(long **)((long)&pSVar16->_type + lVar25);
      lVar14 = *(long *)((long)&pSVar15->_type + lVar25);
      *(long *)((long)&pSVar16->_type + lVar25) = lVar14;
      uVar8 = *(uint *)((long)pSVar15 + lVar25 + -8);
      *(uint *)((long)pSVar16 + lVar25 + -8) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(lVar14 + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar13 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar13 + 0x10))();
        }
      }
      uVar24 = uVar24 + 1;
      lVar25 = lVar25 + 0x28;
    } while (uVar24 < (this->_outervalues)._size);
  }
  if ((this->_localvarinfos)._size != 0) {
    lVar25 = 0;
    uVar24 = 0;
    do {
      pSVar17 = (this->_localvarinfos)._vals;
      pSVar18 = pSVar22->_localvarinfos;
      uVar7 = *(uint *)((long)&(pSVar18->_name).super_SQObject._type + lVar25);
      plVar13 = *(long **)((long)&(pSVar18->_name).super_SQObject._unVal + lVar25);
      lVar14 = *(long *)((long)&(pSVar17->_name).super_SQObject._unVal + lVar25);
      *(long *)((long)&(pSVar18->_name).super_SQObject._unVal + lVar25) = lVar14;
      uVar8 = *(uint *)((long)&(pSVar17->_name).super_SQObject._type + lVar25);
      *(uint *)((long)&(pSVar18->_name).super_SQObject._type + lVar25) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(lVar14 + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar13 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar13 + 0x10))();
        }
      }
      *(undefined8 *)((long)&pSVar18->_pos + lVar25) =
           *(undefined8 *)((long)&pSVar17->_pos + lVar25);
      puVar3 = (undefined8 *)((long)&pSVar17->_start_op + lVar25);
      uVar21 = puVar3[1];
      puVar4 = (undefined8 *)((long)&pSVar18->_start_op + lVar25);
      *puVar4 = *puVar3;
      puVar4[1] = uVar21;
      uVar24 = uVar24 + 1;
      lVar25 = lVar25 + 0x28;
    } while (uVar24 < (this->_localvarinfos)._size);
  }
  if ((this->_lineinfos)._size != 0) {
    lVar25 = 0;
    uVar24 = 0;
    do {
      puVar3 = (undefined8 *)((long)&((this->_lineinfos)._vals)->_line + lVar25);
      uVar21 = puVar3[1];
      puVar4 = (undefined8 *)((long)&pSVar22->_lineinfos->_line + lVar25);
      *puVar4 = *puVar3;
      puVar4[1] = uVar21;
      uVar24 = uVar24 + 1;
      lVar25 = lVar25 + 0x10;
    } while (uVar24 < (this->_lineinfos)._size);
  }
  if ((this->_defaultparams)._size != 0) {
    plVar19 = (this->_defaultparams)._vals;
    pSVar20 = pSVar22->_defaultparams;
    uVar24 = 0;
    do {
      pSVar20[uVar24] = plVar19[uVar24];
      uVar24 = uVar24 + 1;
    } while (uVar24 < (this->_defaultparams)._size);
  }
  memcpy(pSVar22->_instructions,(this->_instructions)._vals,(this->_instructions)._size << 3);
  pSVar22->_varparams = (ulong)this->_varparams;
  SQObjectPtr::~SQObjectPtr(&val);
  SQObjectPtr::~SQObjectPtr(&key);
  SQObjectPtr::~SQObjectPtr(&refidx);
  return pSVar22;
}

Assistant:

SQFunctionProto *SQFuncState::BuildProto()
{

    SQFunctionProto *f=SQFunctionProto::Create(_ss,_instructions.size(),
        _nliterals,_parameters.size(),_functions.size(),_outervalues.size(),
        _lineinfos.size(),_localvarinfos.size(),_defaultparams.size());

    SQObjectPtr refidx,key,val;
    SQInteger idx;

    f->_stacksize = _stacksize;
    f->_sourcename = _sourcename;
    f->_bgenerator = _bgenerator;
    f->_name = _name;

    while((idx=_table(_literals)->Next(false,refidx,key,val))!=-1) {
        f->_literals[_integer(val)]=key;
        refidx=idx;
    }

    for(SQUnsignedInteger nf = 0; nf < _functions.size(); nf++) f->_functions[nf] = _functions[nf];
    for(SQUnsignedInteger np = 0; np < _parameters.size(); np++) f->_parameters[np] = _parameters[np];
    for(SQUnsignedInteger no = 0; no < _outervalues.size(); no++) f->_outervalues[no] = _outervalues[no];
    for(SQUnsignedInteger nl = 0; nl < _localvarinfos.size(); nl++) f->_localvarinfos[nl] = _localvarinfos[nl];
    for(SQUnsignedInteger ni = 0; ni < _lineinfos.size(); ni++) f->_lineinfos[ni] = _lineinfos[ni];
    for(SQUnsignedInteger nd = 0; nd < _defaultparams.size(); nd++) f->_defaultparams[nd] = _defaultparams[nd];

    memcpy(f->_instructions,&_instructions[0],_instructions.size()*sizeof(SQInstruction));

    f->_varparams = _varparams;

    return f;
}